

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O2

void __thiscall TgBot::Url::Url(Url *this,string *url)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  ulong uVar9;
  bool bVar10;
  
  (this->protocol)._M_dataplus._M_p = (pointer)&(this->protocol).field_2;
  (this->protocol)._M_string_length = 0;
  uVar9 = 0;
  (this->protocol).field_2._M_local_buf[0] = '\0';
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  cVar3 = (char)this;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  (this->query)._M_string_length = 0;
  cVar7 = cVar3 + '@';
  (this->query).field_2._M_local_buf[0] = '\0';
  (this->fragment)._M_dataplus._M_p = (pointer)&(this->fragment).field_2;
  (this->fragment)._M_string_length = 0;
  (this->fragment).field_2._M_local_buf[0] = '\0';
  uVar2 = url->_M_string_length;
  bVar4 = false;
  bVar10 = false;
  bVar6 = false;
  bVar5 = false;
  do {
    if (uVar2 <= uVar9) {
      return;
    }
    cVar1 = (url->_M_dataplus)._M_p[uVar9];
    if (bVar5) {
      if (bVar6) {
        if (bVar10) {
          cVar8 = cVar3 + -0x80;
          if (bVar4) goto LAB_0020c93a;
          if (cVar1 == '#') {
            bVar4 = true;
          }
          else {
            std::__cxx11::string::push_back(cVar3 + '`');
            bVar4 = false;
          }
LAB_0020c988:
          bVar10 = true;
          bVar6 = true;
        }
        else {
          bVar6 = true;
          if (cVar1 == '?') {
            bVar10 = true;
          }
          else {
            if (cVar1 == '#') {
              bVar4 = true;
              goto LAB_0020c988;
            }
            std::__cxx11::string::push_back(cVar7);
            bVar10 = false;
          }
        }
LAB_0020c98b:
        bVar5 = true;
      }
      else {
        cVar8 = cVar7;
        if (cVar1 == '#') {
LAB_0020c93a:
          bVar4 = true;
          std::__cxx11::string::push_back(cVar8);
          bVar10 = true;
          bVar6 = true;
          bVar5 = true;
        }
        else if (cVar1 == '?') {
          bVar10 = true;
          std::__cxx11::string::push_back(cVar7);
          bVar6 = true;
          bVar5 = true;
        }
        else if (cVar1 == '/') {
          bVar6 = true;
          std::__cxx11::string::push_back(cVar7);
          bVar5 = true;
        }
        else {
          std::__cxx11::string::push_back(cVar3 + ' ');
          bVar5 = true;
          bVar6 = false;
        }
      }
    }
    else {
      if (cVar1 == ':') {
        uVar9 = uVar9 + 2;
        goto LAB_0020c98b;
      }
      std::__cxx11::string::push_back(cVar3);
      bVar5 = false;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Url::Url(const string& url) {
    bool isProtocolParsed = false;
    bool isHostParsed = false;
    bool isPathParsed = false;
    bool isQueryParsed = false;

    for (size_t i = 0, count = url.length(); i < count; ++i) {
        char c = url[i];

        if (!isProtocolParsed) {
            if (c == ':') {
                isProtocolParsed = true;
                i += 2;
            } else {
                protocol += c;
            }
        } else if (!isHostParsed) {
            if (c == '/') {
                isHostParsed = true;
                path += '/';
            } else if (c == '?') {
                isHostParsed = isPathParsed = true;
                path += '/';
            } else if (c == '#') {
                isHostParsed = isPathParsed = isQueryParsed = true;
                path += '/';
            } else {
                host += c;
            }
        } else if (!isPathParsed) {
            if (c == '?') {
                isPathParsed = true;
            } else if (c == '#') {
                isPathParsed = isQueryParsed = true;
            } else {
                path += c;
            }
        } else if (!isQueryParsed) {
            if (c == '#') {
                isQueryParsed = true;
            } else {
                query += c;
            }
        } else {
            fragment += c;
        }
    }
}